

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintStats(Abc_Ntk_t *pNtk,int fFactored,int fSaveBest,int fDumpResult,int fUseLutLib,
                      int fPrintMuxes,int fPower,int fGlitch,int fSkipBuf,int fSkipSmall,
                      int fPrintMem)

{
  Abc_ManTime_t *pAVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Abc_NtkType_t AVar6;
  void *pvVar7;
  void *pvVar8;
  FILE *__stream;
  uint uVar9;
  char *pcVar10;
  Abc_Ntk_t *pAVar11;
  float fVar12;
  double dVar13;
  
  iVar2 = 0;
  pAVar11 = pNtk;
  if (fSkipBuf != 0) {
    iVar2 = Abc_NtkGetBufNum(pNtk);
  }
  iVar4 = (int)pAVar11;
  if ((fPrintMuxes != 0) && (pNtk->ntkType == ABC_NTK_STRASH)) {
    uVar3 = Abc_NtkGetExorNum(pNtk);
    pAVar11 = pNtk;
    iVar4 = Abc_NtkCountMuxes(pNtk);
    uVar9 = (pNtk->nObjCounts[7] - iVar2) + iVar4 * -3;
    iVar2 = (int)pAVar11;
    Abc_Print(iVar2,"XMA stats:  ");
    Abc_Print(iVar2,"Xor =%7d (%6.2f %%)  ",
              ((double)(int)uVar3 * 300.0) / (double)pNtk->nObjCounts[7],(ulong)uVar3);
    Abc_Print(iVar2,"Mux =%7d (%6.2f %%)  ",
              ((double)(int)(iVar4 - uVar3) * 300.0) / (double)pNtk->nObjCounts[7],
              (ulong)(iVar4 - uVar3));
    Abc_Print(iVar2,"And =%7d (%6.2f %%)  ",
              ((double)(int)uVar9 * 100.0) / (double)pNtk->nObjCounts[7],(ulong)uVar9);
    Abc_Print(iVar2,"Total =%7d",(ulong)(uVar9 + iVar4));
    Abc_Print(iVar2,"\n");
    return;
  }
  if (fSaveBest != 0) {
    pAVar11 = pNtk;
    Abc_NtkCompareAndSaveBest(pNtk);
    iVar4 = (int)pAVar11;
  }
  Abc_Print(iVar4,"%s%-30s:%s","\x1b[1;37m",pNtk->pName,"\x1b[0m");
  Abc_Print(iVar4," i/o =%5d/%5d",(ulong)(uint)pNtk->vPis->nSize,(ulong)(uint)pNtk->vPos->nSize);
  if (pNtk->nConstrs != 0) {
    Abc_Print(iVar4,"(c=%d)");
  }
  Abc_Print(iVar4,"  lat =%5d",(ulong)(uint)pNtk->nObjCounts[8]);
  if (pNtk->nBarBufs != 0) {
    Abc_Print(iVar4,"(b=%d)");
  }
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Abc_Print(iVar4,"  and =%7d",(ulong)(uint)pNtk->nObjCounts[7]);
    iVar4 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar4 != 0) {
      pAVar11 = pNtk;
      uVar3 = Abc_NtkGetChoiceNum(pNtk);
      iVar4 = (int)pAVar11;
      pcVar10 = " (choice = %d)";
      goto LAB_002ed464;
    }
  }
  else {
    if (pNtk->ntkType == ABC_NTK_NETLIST) {
      Abc_Print(iVar4,"  net =%5d",(ulong)(uint)pNtk->nObjCounts[6]);
      if (fSkipSmall == 0) {
        uVar3 = pNtk->nObjCounts[7] - iVar2;
      }
      else {
        pAVar11 = pNtk;
        uVar3 = Abc_NtkGetLargeNodeNum(pNtk);
        iVar4 = (int)pAVar11;
      }
      Abc_Print(iVar4,"  nd =%5d",(ulong)uVar3);
      Abc_Print(iVar4,"  wbox =%3d",(ulong)(uint)pNtk->nObjCounts[9]);
      uVar3 = pNtk->nObjCounts[10];
      pcVar10 = "  bbox =%3d";
    }
    else {
      if (fSkipSmall == 0) {
        uVar3 = pNtk->nObjCounts[7] - iVar2;
      }
      else {
        pAVar11 = pNtk;
        uVar3 = Abc_NtkGetLargeNodeNum(pNtk);
        iVar4 = (int)pAVar11;
      }
      Abc_Print(iVar4,"  nd =%6d",(ulong)uVar3);
      pAVar11 = pNtk;
      iVar5 = Abc_NtkGetTotalFanins(pNtk);
      iVar4 = (int)pAVar11;
      uVar3 = iVar5 - iVar2;
      pcVar10 = "  edge =%7d";
    }
LAB_002ed464:
    Abc_Print(iVar4,pcVar10,(ulong)uVar3);
  }
  AVar6 = pNtk->ntkType;
  if ((AVar6 | ABC_NTK_LOGIC) == ABC_NTK_STRASH) goto switchD_002ed497_caseD_6;
  switch(pNtk->ntkFunc) {
  case ABC_FUNC_SOP:
    pAVar11 = pNtk;
    iVar4 = Abc_NtkGetCubeNum(pNtk);
    Abc_Print((int)pAVar11,"  cube =%6d",(ulong)(uint)(iVar4 - iVar2));
    if (fFactored != 0) {
      pAVar11 = pNtk;
      iVar4 = Abc_NtkGetLitNum(pNtk);
      Abc_Print((int)pAVar11,"  lit(sop) =%6d",(ulong)(uint)(iVar4 - iVar2));
      pAVar11 = pNtk;
      iVar4 = Abc_NtkGetLitFactNum(pNtk);
      iVar5 = (int)pAVar11;
      uVar3 = iVar4 - iVar2;
      pcVar10 = "  lit(fac) =%6d";
      goto LAB_002ed58e;
    }
    break;
  case ABC_FUNC_BDD:
    pAVar11 = pNtk;
    iVar4 = Abc_NtkGetBddNodeNum(pNtk);
    iVar5 = (int)pAVar11;
    uVar3 = iVar4 - iVar2;
    pcVar10 = "  bdd  =%6d";
    goto LAB_002ed58e;
  case ABC_FUNC_AIG:
    pAVar11 = pNtk;
    iVar4 = Abc_NtkGetAigNodeNum(pNtk);
    iVar5 = (int)pAVar11;
    uVar3 = iVar4 - iVar2;
    pcVar10 = "  aig  =%6d";
LAB_002ed58e:
    Abc_Print(iVar5,pcVar10,(ulong)uVar3);
    break;
  case ABC_FUNC_MAP:
    pvVar8 = pNtk->pManFunc;
    pAVar1 = pNtk->pManTime;
    pvVar7 = Abc_FrameReadLibGen();
    if (pvVar8 != pvVar7) {
      __assert_fail("pNtk->pManFunc == Abc_FrameReadLibGen()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                    ,0x142,
                    "void Abc_NtkPrintStats(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    pAVar11 = pNtk;
    Abc_NtkGetMappedArea(pNtk);
    Abc_Print((int)pAVar11,"  area =%5.2f");
    pAVar11 = pNtk;
    fVar12 = Abc_NtkDelayTrace(pNtk,(Abc_Obj_t *)0x0,(Abc_Obj_t *)0x0,0);
    Abc_Print((int)pAVar11,"  delay =%5.2f",(double)fVar12);
    if ((pAVar1 == (Abc_ManTime_t *)0x0) && (pNtk->pManTime != (Abc_ManTime_t *)0x0)) {
      Abc_ManTimeStop(pNtk->pManTime);
      pNtk->pManTime = (Abc_ManTime_t *)0x0;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x14d,
                  "void Abc_NtkPrintStats(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                 );
  case ABC_FUNC_BLACKBOX:
    goto switchD_002ed497_caseD_6;
  }
  AVar6 = pNtk->ntkType;
switchD_002ed497_caseD_6:
  if (AVar6 == ABC_NTK_STRASH) {
    pAVar11 = pNtk;
    uVar3 = Abc_AigLevel(pNtk);
    iVar2 = (int)pAVar11;
    pcVar10 = "  lev =%3d";
  }
  else {
    pAVar11 = pNtk;
    uVar3 = Abc_NtkLevel(pNtk);
    iVar2 = (int)pAVar11;
    pcVar10 = "  lev = %d";
  }
  Abc_Print(iVar2,pcVar10,(ulong)uVar3);
  if (pNtk->nBarBufs2 != 0) {
    Abc_Print(iVar2,"  buf = %d");
  }
  if (fUseLutLib != 0) {
    pvVar8 = Abc_FrameReadLibLut();
    if (pvVar8 != (void *)0x0) {
      pAVar11 = pNtk;
      fVar12 = Abc_NtkDelayTraceLut(pNtk,1);
      iVar2 = (int)pAVar11;
      Abc_Print(iVar2,"  delay =%5.2f",(double)fVar12);
    }
    pvVar8 = Abc_FrameReadLibLut();
    if (pvVar8 != (void *)0x0) {
      pAVar11 = pNtk;
      fVar12 = Abc_NtkGetArea(pNtk);
      iVar2 = (int)pAVar11;
      Abc_Print(iVar2,"  area =%5.2f",(double)fVar12);
    }
  }
  if (fPower != 0) {
    pAVar11 = pNtk;
    fVar12 = Abc_NtkMfsTotalSwitching(pNtk);
    iVar2 = (int)pAVar11;
    Abc_Print(iVar2,"  power =%7.2f",(double)fVar12);
  }
  if (fGlitch != 0) {
    if ((pNtk->ntkType == ABC_NTK_LOGIC) && (iVar2 = Abc_NtkGetFaninMax(pNtk), iVar2 < 7)) {
      pAVar11 = pNtk;
      fVar12 = Abc_NtkMfsTotalGlitching(pNtk,4000,8,0);
      iVar2 = (int)pAVar11;
      Abc_Print(iVar2,"  glitch =%7.2f %%",(double)fVar12);
    }
    else {
      iVar2 = 0x98ca9e;
      printf("\nCurrently computes glitching only for K-LUT networks with K <= 6.");
    }
  }
  if (fPrintMem != 0) {
    pAVar11 = pNtk;
    dVar13 = Abc_NtkMemory(pNtk);
    iVar2 = (int)pAVar11;
    Abc_Print(iVar2,"  mem =%5.2f MB",dVar13 * 9.5367431640625e-07);
  }
  Abc_Print(iVar2,"\n");
  if (fDumpResult != 0) {
    __stream = fopen("abcstats.txt","a+");
    fprintf(__stream,"%s ",pNtk->pName);
    fprintf(__stream,"%d ",(ulong)(uint)pNtk->vPis->nSize);
    fprintf(__stream,"%d ",(ulong)(uint)pNtk->vPos->nSize);
    fprintf(__stream,"%d ",(ulong)(uint)pNtk->nObjCounts[7]);
    uVar3 = Abc_NtkGetTotalFanins(pNtk);
    fprintf(__stream,"%d ",(ulong)uVar3);
    uVar3 = Abc_NtkLevel(pNtk);
    fprintf(__stream,"%d ",(ulong)uVar3);
    fputc(10,__stream);
    fclose(__stream);
  }
  fflush(_stdout);
}

Assistant:

void Abc_NtkPrintStats( Abc_Ntk_t * pNtk, int fFactored, int fSaveBest, int fDumpResult, int fUseLutLib, int fPrintMuxes, int fPower, int fGlitch, int fSkipBuf, int fSkipSmall, int fPrintMem )
{
    int nSingles = fSkipBuf ? Abc_NtkGetBufNum(pNtk) : 0;
    if ( fPrintMuxes && Abc_NtkIsStrash(pNtk) )
    {
        extern int Abc_NtkCountMuxes( Abc_Ntk_t * pNtk );
        int nXors = Abc_NtkGetExorNum(pNtk);
        int nMuxs = Abc_NtkCountMuxes(pNtk) - nXors;
        int nAnds = Abc_NtkNodeNum(pNtk) - (nMuxs + nXors) * 3 - nSingles;
        Abc_Print( 1, "XMA stats:  " );
        Abc_Print( 1,"Xor =%7d (%6.2f %%)  ", nXors, 300.0 * nXors / Abc_NtkNodeNum(pNtk) );
        Abc_Print( 1,"Mux =%7d (%6.2f %%)  ", nMuxs, 300.0 * nMuxs / Abc_NtkNodeNum(pNtk) );
        Abc_Print( 1,"And =%7d (%6.2f %%)  ",   nAnds, 100.0 * nAnds / Abc_NtkNodeNum(pNtk) );
        Abc_Print( 1,"Total =%7d",   nAnds + nXors + nMuxs );
        Abc_Print( 1,"\n" );
        return;
    }
    if ( fSaveBest )
        Abc_NtkCompareAndSaveBest( pNtk );
/*
    if ( fDumpResult )
    {
        char Buffer[1000] = {0};
        const char * pNameGen = pNtk->pSpec? Extra_FileNameGeneric( pNtk->pSpec ) : "nameless_";
        sprintf( Buffer, "%s_dump.blif", pNameGen );
        Io_Write( pNtk, Buffer, IO_FILE_BLIF );
        if ( pNtk->pSpec ) ABC_FREE( pNameGen );
    }
*/

//    if ( Abc_NtkIsStrash(pNtk) )
//        Abc_AigCountNext( pNtk->pManFunc );

#ifdef WIN32
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 15 ); // bright
    Abc_Print( 1,"%-30s:", pNtk->pName );
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 7 );  // normal
#else
    Abc_Print( 1,"%s%-30s:%s", "\033[1;37m", pNtk->pName, "\033[0m" );  // bright
#endif
    Abc_Print( 1," i/o =%5d/%5d", Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk) );
    if ( Abc_NtkConstrNum(pNtk) )
        Abc_Print( 1,"(c=%d)", Abc_NtkConstrNum(pNtk) );
    Abc_Print( 1,"  lat =%5d", Abc_NtkLatchNum(pNtk) );
    if ( pNtk->nBarBufs )
        Abc_Print( 1,"(b=%d)", pNtk->nBarBufs );
    if ( Abc_NtkIsNetlist(pNtk) )
    {
        Abc_Print( 1,"  net =%5d", Abc_NtkNetNum(pNtk) );
        Abc_Print( 1,"  nd =%5d",  fSkipSmall ? Abc_NtkGetLargeNodeNum(pNtk) : Abc_NtkNodeNum(pNtk) - nSingles );
        Abc_Print( 1,"  wbox =%3d", Abc_NtkWhiteboxNum(pNtk) );
        Abc_Print( 1,"  bbox =%3d", Abc_NtkBlackboxNum(pNtk) );
    }
    else if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 1,"  and =%7d", Abc_NtkNodeNum(pNtk) );
        if ( Abc_NtkGetChoiceNum(pNtk) )
            Abc_Print( 1," (choice = %d)", Abc_NtkGetChoiceNum(pNtk) );
    }
    else
    {
        Abc_Print( 1,"  nd =%6d", fSkipSmall ? Abc_NtkGetLargeNodeNum(pNtk) : Abc_NtkNodeNum(pNtk) - nSingles );
        Abc_Print( 1,"  edge =%7d", Abc_NtkGetTotalFanins(pNtk) - nSingles );
    }

    if ( Abc_NtkIsStrash(pNtk) || Abc_NtkIsNetlist(pNtk) )
    {
    }
    else if ( Abc_NtkHasSop(pNtk) )
    {

        Abc_Print( 1,"  cube =%6d",  Abc_NtkGetCubeNum(pNtk) - nSingles );
        if ( fFactored )
            Abc_Print( 1,"  lit(sop) =%6d",  Abc_NtkGetLitNum(pNtk) - nSingles );
        if ( fFactored )
            Abc_Print( 1,"  lit(fac) =%6d",  Abc_NtkGetLitFactNum(pNtk) - nSingles );
    }
    else if ( Abc_NtkHasAig(pNtk) )
        Abc_Print( 1,"  aig  =%6d",  Abc_NtkGetAigNodeNum(pNtk) - nSingles );
    else if ( Abc_NtkHasBdd(pNtk) )
        Abc_Print( 1,"  bdd  =%6d",  Abc_NtkGetBddNodeNum(pNtk) - nSingles );
    else if ( Abc_NtkHasMapping(pNtk) )
    {
        int fHasTimeMan = (int)(pNtk->pManTime != NULL);
        assert( pNtk->pManFunc == Abc_FrameReadLibGen() );
        Abc_Print( 1,"  area =%5.2f", Abc_NtkGetMappedArea(pNtk) );
        Abc_Print( 1,"  delay =%5.2f", Abc_NtkDelayTrace(pNtk, NULL, NULL, 0) );
        if ( !fHasTimeMan && pNtk->pManTime )
        {
            Abc_ManTimeStop( pNtk->pManTime );
            pNtk->pManTime = NULL;
        }
    }
    else if ( !Abc_NtkHasBlackbox(pNtk) )
    {
        assert( 0 );
    }

    if ( Abc_NtkIsStrash(pNtk) )
    {
        extern int Abc_NtkGetMultiRefNum( Abc_Ntk_t * pNtk );
        Abc_Print( 1,"  lev =%3d", Abc_AigLevel(pNtk) );
//        Abc_Print( 1,"  ff = %5d", Abc_NtkNodeNum(pNtk) + 2 * (Abc_NtkCoNum(pNtk)+Abc_NtkGetMultiRefNum(pNtk)) );
//        Abc_Print( 1,"  var = %5d", Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk)+Abc_NtkGetMultiRefNum(pNtk) );
    }
    else
        Abc_Print( 1,"  lev = %d", Abc_NtkLevel(pNtk) );
    if ( pNtk->nBarBufs2 )
        Abc_Print( 1,"  buf = %d", pNtk->nBarBufs2 );
    if ( fUseLutLib && Abc_FrameReadLibLut() )
        Abc_Print( 1,"  delay =%5.2f", Abc_NtkDelayTraceLut(pNtk, 1) );
    if ( fUseLutLib && Abc_FrameReadLibLut() )
        Abc_Print( 1,"  area =%5.2f", Abc_NtkGetArea(pNtk) );
    if ( fPower )
        Abc_Print( 1,"  power =%7.2f", Abc_NtkMfsTotalSwitching(pNtk) );
    if ( fGlitch )
    {
        if ( Abc_NtkIsLogic(pNtk) && Abc_NtkGetFaninMax(pNtk) <= 6 )
            Abc_Print( 1,"  glitch =%7.2f %%", Abc_NtkMfsTotalGlitching(pNtk, 4000, 8, 0) );
        else
            printf( "\nCurrently computes glitching only for K-LUT networks with K <= 6." );
    }
    if ( fPrintMem )
        Abc_Print( 1,"  mem =%5.2f MB", Abc_NtkMemory(pNtk)/(1<<20) );
    Abc_Print( 1,"\n" );

    // print the statistic into a file
    if ( fDumpResult )
    {
        FILE * pTable = fopen( "abcstats.txt", "a+" );
        fprintf( pTable, "%s ",  pNtk->pName );
        fprintf( pTable, "%d ", Abc_NtkPiNum(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkPoNum(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkNodeNum(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkGetTotalFanins(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkLevel(pNtk) );
        fprintf( pTable, "\n" );
        fclose( pTable );
    }
/*
    {
        FILE * pTable;
        pTable = fopen( "ibm/seq_stats.txt", "a+" );
//        fprintf( pTable, "%s ",  pNtk->pName );
//        fprintf( pTable, "%d ", Abc_NtkPiNum(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkPoNum(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkNodeNum(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkLatchNum(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkLevel(pNtk) );
        fprintf( pTable, "\n" );
        fclose( pTable );
    }
*/

/*
    // print the statistic into a file
    {
        FILE * pTable;
        pTable = fopen( "ucsb/stats.txt", "a+" );
//        fprintf( pTable, "%s ",  pNtk->pSpec );
        fprintf( pTable, "%d ",  Abc_NtkNodeNum(pNtk) );
//        fprintf( pTable, "%d ",  Abc_NtkLevel(pNtk) );
//        fprintf( pTable, "%.0f ", Abc_NtkGetMappedArea(pNtk) );
//        fprintf( pTable, "%.2f ", Abc_NtkDelayTrace(pNtk) );
        fprintf( pTable, "\n" );
        fclose( pTable );
    }
*/

/*
    // print the statistic into a file
    {
        FILE * pTable;
        pTable = fopen( "x/stats_new.txt", "a+" );
        fprintf( pTable, "%s ",  pNtk->pName );
//        fprintf( pTable, "%d ", Abc_NtkPiNum(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkPoNum(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkLevel(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkNodeNum(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkGetTotalFanins(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkLatchNum(pNtk) );
//        fprintf( pTable, "%.2f ", (float)(s_MappingMem)/(float)(1<<20) );
        fprintf( pTable, "%.2f", (float)(s_MappingTime)/(float)(CLOCKS_PER_SEC) );
//        fprintf( pTable, "%.2f", (float)(s_ResynTime)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "\n" );
        fclose( pTable );

        s_ResynTime = 0;
    }
*/

/*
    // print the statistic into a file
    {
        static int Counter = 0;
        extern int timeRetime;
        FILE * pTable;
        Counter++;
        pTable = fopen( "d/stats.txt", "a+" );
        fprintf( pTable, "%s ", pNtk->pName );
//        fprintf( pTable, "%d ", Abc_NtkPiNum(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkPoNum(pNtk) );
//        fprintf( pTable, "%d ", Abc_NtkLatchNum(pNtk) );
        fprintf( pTable, "%d ", Abc_NtkNodeNum(pNtk) );
        fprintf( pTable, "%.2f ", (float)(timeRetime)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "\n" );
        fclose( pTable );
    }


    s_TotalNodes += Abc_NtkNodeNum(pNtk);
    printf( "Total nodes = %6d   %6.2f MB   Changes = %6d.\n", 
        s_TotalNodes, s_TotalNodes * 20.0 / (1<<20), s_TotalChanges );
*/

//    if ( Abc_NtkHasSop(pNtk) )
//        printf( "The total number of cube pairs = %d.\n", Abc_NtkGetCubePairNum(pNtk) );

    fflush( stdout );
    if ( pNtk->pExdc )
        Abc_NtkPrintStats( pNtk->pExdc, fFactored, fSaveBest, fDumpResult, fUseLutLib, fPrintMuxes, fPower, fGlitch, fSkipBuf, fSkipSmall, fPrintMem );
}